

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O0

vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> * xmrig::OclLib::getPlatformIDs(void)

{
  cl_uint cVar1;
  allocator_type *__a;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *in_RDI;
  uint32_t count;
  vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *platforms;
  undefined4 in_stack_ffffffffffffffc8;
  undefined1 *__n;
  uint in_stack_fffffffffffffff0;
  
  cVar1 = getNumPlatforms();
  in_stack_fffffffffffffff0 = in_stack_fffffffffffffff0 & 0xffffff;
  __a = (allocator_type *)(ulong)cVar1;
  __n = &stack0xfffffffffffffff2;
  std::allocator<_cl_platform_id_*>::allocator((allocator<_cl_platform_id_*> *)0x21fedc);
  std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::vector
            ((vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)
             CONCAT44(cVar1,in_stack_fffffffffffffff0),(size_type)__n,__a);
  std::allocator<_cl_platform_id_*>::~allocator((allocator<_cl_platform_id_*> *)0x21fefc);
  if (cVar1 != 0) {
    std::vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_>::data
              ((vector<_cl_platform_id_*,_std::allocator<_cl_platform_id_*>_> *)0x21ff15);
    getPlatformIDs((cl_uint)((ulong)in_RDI >> 0x20),
                   (cl_platform_id *)CONCAT44(cVar1,in_stack_ffffffffffffffc8),(cl_uint *)0x21ff25);
  }
  return in_RDI;
}

Assistant:

std::vector<cl_platform_id> xmrig::OclLib::getPlatformIDs() noexcept
{
    const uint32_t count = getNumPlatforms();
    std::vector<cl_platform_id> platforms(count);

    if (count) {
        getPlatformIDs(count, platforms.data(), nullptr);
    }

    return platforms;
}